

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O1

int query_tex_rectangle_capability(void)

{
  char *pcVar1;
  
  if (has_tex_rectangle_capability == -1) {
    pcVar1 = (char *)glGetString(0x1f03);
    pcVar1 = strstr(pcVar1,"GL_ARB_texture_rectangle");
    if (pcVar1 == (char *)0x0) {
      pcVar1 = (char *)glGetString(0x1f03);
      pcVar1 = strstr(pcVar1,"GL_EXT_texture_rectangle");
      if (pcVar1 == (char *)0x0) {
        pcVar1 = (char *)glGetString(0x1f03);
        pcVar1 = strstr(pcVar1,"GL_NV_texture_rectangle");
        if (pcVar1 == (char *)0x0) {
          has_tex_rectangle_capability = 0;
          return 0;
        }
      }
    }
    has_tex_rectangle_capability = 1;
  }
  return has_tex_rectangle_capability;
}

Assistant:

int query_tex_rectangle_capability( void )
{
	/*	check for the capability	*/
	if( has_tex_rectangle_capability == SOIL_CAPABILITY_UNKNOWN )
	{
		/*	we haven't yet checked for the capability, do so	*/
		if(
			(NULL == strstr( (char const*)glGetString( GL_EXTENSIONS ),
				"GL_ARB_texture_rectangle" ) )
		&&
			(NULL == strstr( (char const*)glGetString( GL_EXTENSIONS ),
				"GL_EXT_texture_rectangle" ) )
		&&
			(NULL == strstr( (char const*)glGetString( GL_EXTENSIONS ),
				"GL_NV_texture_rectangle" ) )
			)
		{
			/*	not there, flag the failure	*/
			has_tex_rectangle_capability = SOIL_CAPABILITY_NONE;
		} else
		{
			/*	it's there!	*/
			has_tex_rectangle_capability = SOIL_CAPABILITY_PRESENT;
		}
	}
	/*	let the user know if we can do texture rectangles or not	*/
	return has_tex_rectangle_capability;
}